

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int cbs_get_any_asn1_element
              (CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag,size_t *out_header_len,int *out_ber_found,
              int *out_indefinite,int ber_ok)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  byte bVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  CBS *cbs_00;
  CBS_ASN1_TAG tag;
  CBS header;
  uint local_4c;
  CBS local_48;
  CBS *local_38;
  
  local_48.data = cbs->data;
  local_48.len = cbs->len;
  local_38 = out;
  if (ber_ok == 0) {
    if (out_ber_found != (int *)0x0) {
      __assert_fail("out_ber_found == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x13f,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
    if (out_indefinite != (int *)0x0) {
      __assert_fail("out_indefinite == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x140,
                    "int cbs_get_any_asn1_element(CBS *, CBS *, CBS_ASN1_TAG *, size_t *, int *, int *, int)"
                   );
    }
  }
  else {
    *out_ber_found = 0;
    *out_indefinite = 0;
  }
  cbs_00 = &local_48;
  iVar3 = parse_asn1_tag(cbs_00,&local_4c);
  if (iVar3 == 0) {
    return 0;
  }
  if (out_tag != (CBS_ASN1_TAG *)0x0) {
    *out_tag = local_4c;
  }
  if (local_48.len == 0) {
    return 0;
  }
  puVar5 = (uint8_t *)(local_48.len - 1);
  bVar8 = *local_48.data;
  uVar6 = cbs->len - (long)puVar5;
  if (-1 < (char)bVar8) {
    puVar9 = (uint8_t *)(bVar8 + uVar6);
    if (out_header_len != (size_t *)0x0) {
      *out_header_len = uVar6;
    }
    goto LAB_001a2e17;
  }
  bVar8 = bVar8 & 0x7f;
  puVar7 = (uint8_t *)(ulong)bVar8;
  if (((ber_ok == 0) || (puVar7 != (uint8_t *)0x0)) ||
     (local_4c = local_4c & 0x20000000, local_4c == 0)) {
    puVar10 = (uint8_t *)(ulong)(bVar8 - 5);
    if (0xfb < (byte)(bVar8 - 5)) {
      puVar10 = puVar5 + -(long)puVar7;
      if (puVar7 <= puVar5) {
        if (puVar7 == (uint8_t *)0x0) {
          puVar10 = (uint8_t *)0x0;
        }
        else {
          puVar9 = (uint8_t *)0x0;
          puVar10 = (uint8_t *)0x0;
          do {
            puVar10 = (uint8_t *)((long)puVar10 << 8 | (ulong)local_48.data[(long)(puVar9 + 1)]);
            puVar9 = puVar9 + 1;
          } while (puVar7 != puVar9);
        }
      }
      if (puVar7 <= puVar5) {
        if (puVar10 < (uint8_t *)0x80) {
          if (ber_ok == 0) goto LAB_001a2e0f;
          *out_ber_found = 1;
        }
        if ((ulong)puVar10 >> (bVar8 * '\b' - 8 & 0x3f) == 0) {
          if (ber_ok == 0) goto LAB_001a2e0f;
          *out_ber_found = 1;
        }
        puVar7 = puVar7 + uVar6;
        puVar5 = (uint8_t *)0x0;
        uVar4 = 0;
        puVar9 = puVar10;
        if ((!CARRY8((ulong)puVar10,(ulong)puVar7)) &&
           (puVar5 = (uint8_t *)0x1, puVar9 = puVar10 + (long)puVar7,
           out_header_len != (size_t *)0x0)) {
          *out_header_len = (size_t)puVar7;
        }
        goto LAB_001a2e13;
      }
    }
LAB_001a2e0f:
    puVar5 = (uint8_t *)0x0;
    uVar4 = 0;
    puVar9 = puVar10;
  }
  else {
    if (out_header_len != (size_t *)0x0) {
      *out_header_len = uVar6;
    }
    *out_ber_found = 1;
    *out_indefinite = 1;
    uVar1 = cbs->len;
    if (uVar6 <= uVar1) {
      cbs_00 = (CBS *)cbs->data;
      cbs->data = (uint8_t *)((long)cbs_00 + uVar6);
      cbs->len = uVar1 - uVar6;
    }
    uVar4 = (uint)(uVar6 <= uVar1);
    puVar5 = (uint8_t *)0x0;
    uVar2 = (uint)(uVar6 <= uVar1);
    puVar9 = (uint8_t *)(ulong)local_4c;
    if (local_38 != (CBS *)0x0) {
      if (uVar1 < uVar6) goto LAB_001a2e13;
      local_38->data = (uint8_t *)cbs_00;
      local_38->len = uVar6;
      uVar2 = 1;
    }
    uVar4 = uVar2;
    puVar5 = (uint8_t *)0x0;
  }
LAB_001a2e13:
  if ((char)puVar5 == '\0') {
    return uVar4;
  }
LAB_001a2e17:
  puVar7 = (uint8_t *)cbs->len;
  if (puVar9 <= puVar7) {
    puVar5 = cbs->data;
    cbs->data = puVar5 + (long)puVar9;
    cbs->len = (long)puVar7 - (long)puVar9;
  }
  uVar4 = (uint)(puVar9 <= puVar7);
  if ((local_38 != (CBS *)0x0) && (puVar9 <= puVar7)) {
    local_38->data = puVar5;
    local_38->len = (size_t)puVar9;
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

static int cbs_get_any_asn1_element(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag,
                                    size_t *out_header_len, int *out_ber_found,
                                    int *out_indefinite, int ber_ok) {
  CBS header = *cbs;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }
  if (ber_ok) {
    *out_ber_found = 0;
    *out_indefinite = 0;
  } else {
    assert(out_ber_found == NULL);
    assert(out_indefinite == NULL);
  }

  CBS_ASN1_TAG tag;
  if (!parse_asn1_tag(&header, &tag)) {
    return 0;
  }
  if (out_tag != NULL) {
    *out_tag = tag;
  }

  uint8_t length_byte;
  if (!CBS_get_u8(&header, &length_byte)) {
    return 0;
  }

  size_t header_len = CBS_len(cbs) - CBS_len(&header);

  size_t len;
  // The format for the length encoding is specified in ITU-T X.690 section
  // 8.1.3.
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = ((size_t)length_byte) + header_len;
    if (out_header_len != NULL) {
      *out_header_len = header_len;
    }
  } else {
    // The high bit indicate that this is the long form, while the next 7 bits
    // encode the number of subsequent octets used to encode the length (ITU-T
    // X.690 clause 8.1.3.5.b).
    const size_t num_bytes = length_byte & 0x7f;
    uint64_t len64;

    if (ber_ok && (tag & CBS_ASN1_CONSTRUCTED) != 0 && num_bytes == 0) {
      // indefinite length
      if (out_header_len != NULL) {
        *out_header_len = header_len;
      }
      *out_ber_found = 1;
      *out_indefinite = 1;
      return CBS_get_bytes(cbs, out, header_len);
    }

    // ITU-T X.690 clause 8.1.3.5.c specifies that the value 0xff shall not be
    // used as the first byte of the length. If this parser encounters that
    // value, num_bytes will be parsed as 127, which will fail this check.
    if (num_bytes == 0 || num_bytes > 4) {
      return 0;
    }
    if (!cbs_get_u(&header, &len64, num_bytes)) {
      return 0;
    }
    // ITU-T X.690 section 10.1 (DER length forms) requires encoding the
    // length with the minimum number of octets. BER could, technically, have
    // 125 superfluous zero bytes. We do not attempt to handle that and still
    // require that the length fit in a |uint32_t| for BER.
    if (len64 < 128) {
      // Length should have used short-form encoding.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    if ((len64 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      if (ber_ok) {
        *out_ber_found = 1;
      } else {
        return 0;
      }
    }
    len = len64;
    if (len + header_len + num_bytes < len) {
      // Overflow.
      return 0;
    }
    len += header_len + num_bytes;
    if (out_header_len != NULL) {
      *out_header_len = header_len + num_bytes;
    }
  }

  return CBS_get_bytes(cbs, out, len);
}